

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::PrimitiveFieldGenerator::PrimitiveFieldGenerator
          (PrimitiveFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__PrimitiveFieldGenerator_0028ec78;
  this->descriptor_ = descriptor;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->messageBitIndex_ = messageBitIndex;
  this->builderBitIndex_ = builderBitIndex;
  anon_unknown_3::SetPrimitiveVariables
            (descriptor,messageBitIndex,builderBitIndex,&this->variables_);
  return;
}

Assistant:

PrimitiveFieldGenerator::
PrimitiveFieldGenerator(const FieldDescriptor* descriptor,
                        int messageBitIndex,
                        int builderBitIndex)
  : descriptor_(descriptor), messageBitIndex_(messageBitIndex),
    builderBitIndex_(builderBitIndex) {
  SetPrimitiveVariables(descriptor, messageBitIndex, builderBitIndex,
                        &variables_);
}